

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O2

void __thiscall tcu::x11::XlibDisplay::processEvents(XlibDisplay *this)

{
  int iVar1;
  XEvent event;
  XEvent local_d0;
  
  while( true ) {
    iVar1 = XPending(this->m_display);
    if (iVar1 == 0) break;
    XNextEvent(this->m_display,&local_d0);
    processEvent(this,&local_d0);
  }
  return;
}

Assistant:

void XlibDisplay::processEvents (void)
{
	XEvent	event;

	while (XPending(m_display))
	{
		XNextEvent(m_display, &event);
		processEvent(event);
	}
}